

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void ui_keymap_query(char *title,wchar_t row)

{
  unkuint9 Var1;
  keypress *src;
  uint8_t uVar3;
  undefined5 uVar4;
  keypress kVar2;
  ui_event_type local_448;
  keypress *act;
  keypress c;
  wchar_t mode;
  char tmp [1024];
  wchar_t row_local;
  char *title_local;
  
  c.code = (player->opts).opt[1] & 1;
  prt(title,L'\r',L'\0');
  prt("Key: ",L'\x0e',L'\0');
  kVar2 = keymap_get_trigger();
  local_448 = CONCAT31(local_448._1_3_,kVar2.mods);
  c.type = local_448;
  Var1 = kVar2._0_9_;
  kVar2._9_3_ = 0;
  kVar2.type = (int)Var1;
  register0x00000034 = (int)(Var1 >> 0x20);
  register0x00000010 = (char)(Var1 >> 0x40);
  src = keymap_find(c.code,kVar2);
  if (src == (keypress *)0x0) {
    prt("No keymap with that trigger.  Press any key to continue.",L'\x10',L'\0');
    inkey();
  }
  else {
    keypress_to_text((char *)&c.mods,0x400,src,false);
    prt("Found: ",L'\x0f',L'\0');
    Term_addstr(L'\xffffffff',L'\x01',(char *)&c.mods);
    prt("Press any key to continue.",L'\x11',L'\0');
    inkey();
  }
  return;
}

Assistant:

static void ui_keymap_query(const char *title, int row)
{
	char tmp[1024];
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;
	struct keypress c;
	const struct keypress *act;

	prt(title, 13, 0);
	prt("Key: ", 14, 0);
	
	/* Get a keymap trigger & mapping */
	c = keymap_get_trigger();
	act = keymap_find(mode, c);
	
	/* Keymap found? */
	if (!act) {
		/* Prompt */
		prt("No keymap with that trigger.  Press any key to continue.", 16, 0);
		inkey();
	} else {
		/* Analyze the current action */
		keypress_to_text(tmp, sizeof(tmp), act, false);
	
		/* Display the current action */
		prt("Found: ", 15, 0);
		Term_addstr(-1, COLOUR_WHITE, tmp);

		prt("Press any key to continue.", 17, 0);
		inkey();
	}
}